

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

double sentencepiece::log_domain::LogSum(vector<double,_std::allocator<double>_> *xs)

{
  bool bVar1;
  const_reference pvVar2;
  double xa;
  double dVar3;
  vector<double,_std::allocator<double>_> *in_RDI;
  int i;
  anon_class_1_0_00000001 log_add;
  double sum;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 local_18;
  undefined8 local_8;
  
  bVar1 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    local_8 = std::numeric_limits<double>::max();
    local_8 = local_8 * -1.0;
  }
  else {
    pvVar2 = std::vector<double,_std::allocator<double>_>::front(in_stack_ffffffffffffffd0);
    local_18 = *pvVar2;
    iVar4 = 1;
    while( true ) {
      xa = (double)(long)iVar4;
      dVar3 = (double)std::vector<double,_std::allocator<double>_>::size(in_RDI);
      if ((ulong)dVar3 <= (ulong)xa) break;
      std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)iVar4);
      local_18 = LogSum::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)CONCAT44(in_stack_ffffffffffffffe4,iVar4),xa,
                            local_18);
      iVar4 = iVar4 + 1;
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

double LogSum(const std::vector<double> &xs) {
  if (xs.empty()) {
    return -1.0 * std::numeric_limits<double>::max();
  }
  double sum = xs.front();

  auto log_add = [](double xa, double xb) {
    if (xa > xb) {
      std::swap(xa, xb);
    }
    return xb + std::log1p(std::exp(xa - xb));
  };
  for (int i = 1; i < xs.size(); ++i) {
    sum = log_add(sum, xs[i]);
  }
  return sum;
}